

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

ObjWriteGuardBucket * __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Get
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this,int value)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  char cVar6;
  Type *unaff_R12;
  SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar7 = this->table + (ulong)(uint)value % (ulong)this->tableSize;
  local_40 = (undefined1  [8])pSVar7;
  __iter.list = pSVar7;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if (pSVar7 == (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pSVar7 = __iter.list;
    }
    __iter.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                  (pSVar7->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) goto LAB_003ef41f;
    pTVar5 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    iVar1 = pTVar5->value;
    if (iVar1 != value) {
      pTVar5 = unaff_R12;
    }
    cVar6 = (iVar1 != value) * '\x02' + '\x01';
    if (value < iVar1) {
      cVar6 = '\0';
    }
    if (cVar6 != '\0') break;
    pSVar7 = __iter.list;
    if (iVar1 <= value) {
      unaff_R12 = pTVar5;
    }
  }
  if ((cVar6 == '\x03') || (value < iVar1)) {
LAB_003ef41f:
    pTVar5 = (Type *)0x0;
  }
  return &pTVar5->element;
}

Assistant:

T * Get(int value)
    {
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(Bucket<T>, bucket, &this->table[this->Hash(value)])
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return nullptr;
    }